

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O1

int __thiscall
kratos::CombinationalStmtBlock::clone
          (CombinationalStmtBlock *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  StmtBlock *local_38;
  shared_ptr<kratos::CombinationalStmtBlock> stmt;
  
  local_38 = (StmtBlock *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::CombinationalStmtBlock,std::allocator<kratos::CombinationalStmtBlock>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt,
             (CombinationalStmtBlock **)&local_38,
             (allocator<kratos::CombinationalStmtBlock> *)
             ((long)&stmt.
                     super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::__shared_ptr<kratos::CombinationalStmtBlock,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::CombinationalStmtBlock,kratos::CombinationalStmtBlock>
            ((__shared_ptr<kratos::CombinationalStmtBlock,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (CombinationalStmtBlock *)local_38);
  StmtBlock::clone_block((StmtBlock *)__fn,local_38);
  (this->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode = (_func_int **)local_38;
  (this->super_StmtBlock).super_Stmt.super_IRNode.fn_name_ln.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_StmtBlock).super_Stmt.super_IRNode.fn_name_ln.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)stmt.super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
  return (int)this;
}

Assistant:

std::shared_ptr<Stmt> CombinationalStmtBlock::clone() const {
    auto stmt = std::make_shared<CombinationalStmtBlock>();
    clone_block(stmt.get());
    return stmt;
}